

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

FunctionBody * __thiscall
Js::ProbeContainer::GetGlobalFunc
          (ProbeContainer *this,ScriptContext *scriptContext,DWORD_PTR secondaryHostSourceContext)

{
  FunctionBody *pFVar1;
  DWORD_PTR local_20;
  DWORD_PTR secondaryHostSourceContext_local;
  ScriptContext *scriptContext_local;
  ProbeContainer *this_local;
  
  local_20 = secondaryHostSourceContext;
  secondaryHostSourceContext_local = (DWORD_PTR)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  pFVar1 = ScriptContext::
           FindFunction<Js::ProbeContainer::GetGlobalFunc(Js::ScriptContext*,unsigned_long)::__0>
                     (scriptContext,(anon_class_8_1_717c5cf6_for_predicate)&local_20);
  return pFVar1;
}

Assistant:

FunctionBody * ProbeContainer::GetGlobalFunc(ScriptContext* scriptContext, DWORD_PTR secondaryHostSourceContext)
    {
        return scriptContext->FindFunction([&secondaryHostSourceContext] (FunctionBody* pFunc) {
            return ((pFunc->GetSecondaryHostSourceContext() == secondaryHostSourceContext) &&
                     pFunc->GetIsGlobalFunc());
        });
    }